

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

void __thiscall btSoftBody::setTotalMass(btSoftBody *this,btScalar mass,bool fromfaces)

{
  int iVar1;
  Node *pNVar2;
  Face *pFVar3;
  Node *pNVar4;
  Node *pNVar5;
  long lVar6;
  undefined1 auVar7 [16];
  long lVar8;
  long lVar9;
  undefined7 in_register_00000031;
  long lVar10;
  float fVar11;
  int iVar13;
  undefined1 auVar12 [16];
  float fVar14;
  undefined1 auVar15 [16];
  float fVar16;
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  float fVar22;
  int iVar23;
  
  auVar7 = _DAT_001f5270;
  if ((int)CONCAT71(in_register_00000031,fromfaces) != 0) {
    iVar1 = (this->m_nodes).m_size;
    if (0 < (long)iVar1) {
      pNVar2 = (this->m_nodes).m_data;
      lVar9 = (long)iVar1 + -1;
      auVar12._8_4_ = (int)lVar9;
      auVar12._0_8_ = lVar9;
      auVar12._12_4_ = (int)((ulong)lVar9 >> 0x20);
      lVar9 = 0;
      auVar12 = auVar12 ^ _DAT_001f5270;
      auVar15 = _DAT_001f57f0;
      auVar17 = _DAT_001f55c0;
      do {
        auVar21 = auVar17 ^ auVar7;
        iVar13 = auVar12._4_4_;
        if ((bool)(~(auVar21._4_4_ == iVar13 && auVar12._0_4_ < auVar21._0_4_ ||
                    iVar13 < auVar21._4_4_) & 1)) {
          *(undefined4 *)((long)(&pNVar2->m_n + 1) + lVar9) = 0;
        }
        if ((auVar21._12_4_ != auVar12._12_4_ || auVar21._8_4_ <= auVar12._8_4_) &&
            auVar21._12_4_ <= auVar12._12_4_) {
          *(undefined4 *)((long)(&pNVar2[1].m_n + 1) + lVar9) = 0;
        }
        auVar21 = auVar15 ^ auVar7;
        iVar23 = auVar21._4_4_;
        if (iVar23 <= iVar13 && (iVar23 != iVar13 || auVar21._0_4_ <= auVar12._0_4_)) {
          *(undefined4 *)((long)(&pNVar2[2].m_n + 1) + lVar9) = 0;
          *(undefined4 *)((long)(&pNVar2[3].m_n + 1) + lVar9) = 0;
        }
        lVar10 = auVar17._8_8_;
        auVar17._0_8_ = auVar17._0_8_ + 4;
        auVar17._8_8_ = lVar10 + 4;
        lVar10 = auVar15._8_8_;
        auVar15._0_8_ = auVar15._0_8_ + 4;
        auVar15._8_8_ = lVar10 + 4;
        lVar9 = lVar9 + 0x1e0;
      } while ((ulong)(iVar1 + 3U >> 2) * 0x1e0 - lVar9 != 0);
    }
    if (0 < (this->m_faces).m_size) {
      lVar9 = 0x10;
      lVar10 = 0;
      do {
        pFVar3 = (this->m_faces).m_data;
        pNVar2 = pFVar3[lVar10].m_n[0];
        pNVar4 = pFVar3[lVar10].m_n[1];
        pNVar5 = pFVar3[lVar10].m_n[2];
        fVar22 = (pNVar2->m_x).m_floats[0];
        fVar11 = (pNVar2->m_x).m_floats[1];
        fVar14 = (pNVar4->m_x).m_floats[0] - fVar22;
        fVar18 = (pNVar4->m_x).m_floats[1] - fVar11;
        fVar20 = (pNVar2->m_x).m_floats[2];
        fVar16 = (pNVar4->m_x).m_floats[2] - fVar20;
        fVar22 = (pNVar5->m_x).m_floats[0] - fVar22;
        fVar11 = (pNVar5->m_x).m_floats[1] - fVar11;
        fVar20 = (pNVar5->m_x).m_floats[2] - fVar20;
        fVar19 = fVar18 * fVar20 - fVar11 * fVar16;
        fVar20 = fVar16 * fVar22 - fVar20 * fVar14;
        fVar22 = fVar11 * fVar14 - fVar22 * fVar18;
        fVar22 = fVar22 * fVar22 + fVar19 * fVar19 + fVar20 * fVar20;
        if (fVar22 < 0.0) {
          fVar22 = sqrtf(fVar22);
        }
        else {
          fVar22 = SQRT(fVar22);
        }
        lVar8 = 0;
        do {
          lVar6 = *(long *)((long)pFVar3->m_n + lVar8 * 8 + lVar9 + -0x10);
          *(float *)(lVar6 + 0x60) = *(float *)(lVar6 + 0x60) + fVar22;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        lVar10 = lVar10 + 1;
        lVar9 = lVar9 + 0x48;
      } while (lVar10 < (this->m_faces).m_size);
    }
    lVar9 = (long)(this->m_nodes).m_size;
    if (0 < lVar9) {
      pNVar2 = (this->m_nodes).m_data;
      lVar10 = 0;
      do {
        *(float *)((long)(&pNVar2->m_n + 1) + lVar10) =
             1.0 / *(float *)((long)(&pNVar2->m_n + 1) + lVar10);
        lVar10 = lVar10 + 0x78;
      } while (lVar9 * 0x78 - lVar10 != 0);
    }
  }
  lVar9 = (long)(this->m_nodes).m_size;
  if (lVar9 < 1) {
    fVar22 = 0.0;
  }
  else {
    fVar22 = 0.0;
    lVar10 = 0;
    do {
      fVar11 = *(float *)((long)(&((this->m_nodes).m_data)->m_n + 1) + lVar10);
      fVar22 = fVar22 + (float)(-(uint)(0.0 < fVar11) & (uint)(1.0 / fVar11));
      lVar10 = lVar10 + 0x78;
    } while (lVar9 * 0x78 - lVar10 != 0);
  }
  lVar9 = (long)(this->m_nodes).m_size;
  if (0 < lVar9) {
    pNVar2 = (this->m_nodes).m_data;
    lVar10 = 0;
    do {
      *(float *)((long)(&pNVar2->m_n + 1) + lVar10) =
           *(float *)((long)(&pNVar2->m_n + 1) + lVar10) / ((1.0 / fVar22) * mass);
      lVar10 = lVar10 + 0x78;
    } while (lVar9 * 0x78 - lVar10 != 0);
  }
  this->m_bUpdateRtCst = true;
  return;
}

Assistant:

void			btSoftBody::setTotalMass(btScalar mass,bool fromfaces)
{
	int i;

	if(fromfaces)
	{

		for(i=0;i<m_nodes.size();++i)
		{
			m_nodes[i].m_im=0;
		}
		for(i=0;i<m_faces.size();++i)
		{
			const Face&		f=m_faces[i];
			const btScalar	twicearea=AreaOf(	f.m_n[0]->m_x,
				f.m_n[1]->m_x,
				f.m_n[2]->m_x);
			for(int j=0;j<3;++j)
			{
				f.m_n[j]->m_im+=twicearea;
			}
		}
		for( i=0;i<m_nodes.size();++i)
		{
			m_nodes[i].m_im=1/m_nodes[i].m_im;
		}
	}
	const btScalar	tm=getTotalMass();
	const btScalar	itm=1/tm;
	for( i=0;i<m_nodes.size();++i)
	{
		m_nodes[i].m_im/=itm*mass;
	}
	m_bUpdateRtCst=true;
}